

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

QDateTime __thiscall QFileInfo::fileTime(QFileInfo *this,FileTime time,QTimeZone *tz)

{
  long lVar1;
  anon_class_16_2_d7082d20 fsLambda_00;
  anon_class_16_2_d7082d20 engineLambda_00;
  QFileInfoPrivate *this_00;
  undefined4 in_EDX;
  Data in_RDI;
  long in_FS_OFFSET;
  QFileInfoPrivate *d;
  QDateTime dt;
  MetaDataFlags flag;
  anon_class_16_2_d7082d20 engineLambda;
  anon_class_16_2_d7082d20 fsLambda;
  undefined8 in_stack_ffffffffffffff38;
  MetaDataFlag flags;
  QFlags<QFileSystemMetaData::MetaDataFlag> *in_stack_ffffffffffffff40;
  Data this_01;
  Data DVar2;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> fsFlags;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined8 uStack_10;
  
  flags = (MetaDataFlag)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  DVar2 = in_RDI;
  this_00 = d_func((QFileInfo *)0x120f16);
  fsFlags.i = DVar2._4_4_;
  uVar3 = 0xaaaaaaaa;
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)0x120f2d);
  switch(in_EDX) {
  case 0:
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags(in_stack_ffffffffffffff40,flags);
    uVar3 = in_stack_ffffffffffffffb0;
    break;
  case 1:
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags(in_stack_ffffffffffffff40,flags);
    uVar3 = local_54;
    break;
  case 2:
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags(in_stack_ffffffffffffff40,flags);
    uVar3 = local_58;
    break;
  case 3:
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags(in_stack_ffffffffffffff40,flags);
    uVar3 = local_5c;
  }
  uStack_10 = (QFileInfoPrivate *)CONCAT44(0xaaaaaaaa,in_EDX);
  fsLambda_00.d._4_4_ = uVar3;
  fsLambda_00.d._0_4_ = in_stack_ffffffffffffffb0;
  fsLambda_00._8_8_ = this_00;
  engineLambda_00._8_8_ = this_00;
  engineLambda_00.d = uStack_10;
  QFileInfoPrivate::
  checkAttribute<QDateTime,QFileInfo::fileTime(QFileDevice::FileTime,QTimeZone_const&)const::__0,QFileInfo::fileTime(QFileDevice::FileTime,QTimeZone_const&)const::__1>
            (this_00,(MetaDataFlags)fsFlags.i,fsLambda_00,engineLambda_00);
  QDateTime::toTimeZone((QDateTime *)this_01.d,(QTimeZone *)in_RDI.d);
  QDateTime::~QDateTime((QDateTime *)0x12108d);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDateTime)this_01;
}

Assistant:

QDateTime QFileInfo::fileTime(QFile::FileTime time, const QTimeZone &tz) const
{
    Q_D(const QFileInfo);
    QFileSystemMetaData::MetaDataFlags flag;
    switch (time) {
    case QFile::FileAccessTime:
        flag = QFileSystemMetaData::AccessTime;
        break;
    case QFile::FileBirthTime:
        flag = QFileSystemMetaData::BirthTime;
        break;
    case QFile::FileMetadataChangeTime:
        flag = QFileSystemMetaData::MetadataChangeTime;
        break;
    case QFile::FileModificationTime:
        flag = QFileSystemMetaData::ModificationTime;
        break;
    }

    auto fsLambda = [d, time]() { return d->metaData.fileTime(time); };
    auto engineLambda = [d, time]() { return d->getFileTime(time); };
    const auto dt =
        d->checkAttribute<QDateTime>(flag, std::move(fsLambda), std::move(engineLambda));
    return dt.toTimeZone(tz);
}